

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O0

void __thiscall SQASTWritingVisitor::writeNodeHeader(SQASTWritingVisitor *this,Node *n)

{
  Node *in_RSI;
  long in_RDI;
  int32_t in_stack_ffffffffffffffbc;
  OutputStream *this_00;
  
  this_00 = *(OutputStream **)(in_RDI + 8);
  SQCompilation::Node::op(in_RSI);
  OutputStream::writeInt32(this_00,in_stack_ffffffffffffffbc);
  SQCompilation::Node::lineStart(in_RSI);
  OutputStream::writeInt32(this_00,in_stack_ffffffffffffffbc);
  SQCompilation::Node::columnStart(in_RSI);
  OutputStream::writeInt32(this_00,in_stack_ffffffffffffffbc);
  SQCompilation::Node::lineEnd(in_RSI);
  OutputStream::writeInt32(this_00,in_stack_ffffffffffffffbc);
  SQCompilation::Node::columnEnd(in_RSI);
  OutputStream::writeInt32(this_00,in_stack_ffffffffffffffbc);
  return;
}

Assistant:

void SQASTWritingVisitor::writeNodeHeader(const Node *n) {
  stream->writeInt32(n->op() + OP_DELTA);

  stream->writeInt32(n->lineStart());
  stream->writeInt32(n->columnStart());
  stream->writeInt32(n->lineEnd());
  stream->writeInt32(n->columnEnd());
}